

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

void __thiscall Omega_h::any::swap(any *this,any *rhs)

{
  undefined1 local_30 [8];
  any tmp;
  any *rhs_local;
  any *this_local;
  
  tmp.vtable = (vtable_type *)rhs;
  if (this->vtable == rhs->vtable) {
    if (this->vtable != (vtable_type *)0x0) {
      (*this->vtable->swap)(&this->storage,&rhs->storage);
    }
  }
  else {
    any((any *)local_30,rhs);
    (tmp.vtable)->copy = (_func_void_storage_union_ptr_storage_union_ptr *)this->vtable;
    if (this->vtable != (vtable_type *)0x0) {
      (*this->vtable->move)(&this->storage,(storage_union *)tmp.vtable);
    }
    this->vtable = (vtable_type *)tmp.storage._8_8_;
    if (tmp.storage._8_8_ != 0) {
      (**(code **)(tmp.storage._8_8_ + 0x18))(local_30,this);
      tmp.storage._8_8_ = 0;
    }
    ~any((any *)local_30);
  }
  return;
}

Assistant:

void swap(any& rhs) noexcept {
    if (this->vtable != rhs.vtable) {
      any tmp(std::move(rhs));

      // move from *this to rhs.
      rhs.vtable = this->vtable;
      if (this->vtable != nullptr) {
        this->vtable->move(this->storage, rhs.storage);
        // this->vtable = nullptr; -- uneeded, see below
      }

      // move from tmp (previously rhs) to *this.
      this->vtable = tmp.vtable;
      if (tmp.vtable != nullptr) {
        tmp.vtable->move(tmp.storage, this->storage);
        tmp.vtable = nullptr;
      }
    } else  // same types
    {
      if (this->vtable != nullptr)
        this->vtable->swap(this->storage, rhs.storage);
    }
  }